

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O0

int dwarf_dnames_header(Dwarf_Debug dbg,Dwarf_Off starting_offset,Dwarf_Dnames_Head *dn_out,
                       Dwarf_Off *offset_of_next_table,Dwarf_Error *error)

{
  int iVar1;
  Dwarf_Small *pDVar2;
  Dwarf_Small *pDStack_78;
  int res;
  Dwarf_Small *curptr;
  Dwarf_Small *end_section;
  Dwarf_Small *start_section;
  Dwarf_Unsigned next_offset;
  Dwarf_Unsigned usedspace;
  Dwarf_Unsigned section_size;
  Dwarf_Dnames_Head dn;
  Dwarf_Unsigned remaining;
  Dwarf_Error *error_local;
  Dwarf_Off *offset_of_next_table_local;
  Dwarf_Dnames_Head *dn_out_local;
  Dwarf_Off starting_offset_local;
  Dwarf_Debug dbg_local;
  
  dn = (Dwarf_Dnames_Head)0x0;
  section_size = 0;
  usedspace = 0;
  next_offset = 0;
  start_section = (Dwarf_Small *)0x0;
  remaining = (Dwarf_Unsigned)error;
  error_local = (Dwarf_Error *)offset_of_next_table;
  offset_of_next_table_local = (Dwarf_Off *)dn_out;
  dn_out_local = (Dwarf_Dnames_Head *)starting_offset;
  starting_offset_local = (Dwarf_Off)dbg;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_dnames_header()either null or it containsa stale Dwarf_Debug pointer"
                       );
    dbg_local._4_4_ = 1;
  }
  else {
    dbg_local._4_4_ = _dwarf_load_section(dbg,&dbg->de_debug_names,error);
    if (dbg_local._4_4_ == 0) {
      usedspace = *(Dwarf_Unsigned *)(starting_offset_local + 0x848);
      if (usedspace == 0) {
        dbg_local._4_4_ = -1;
      }
      else {
        iVar1 = _dwarf_load_section((Dwarf_Debug)starting_offset_local,
                                    (Dwarf_Section_s *)(starting_offset_local + 0x9d0),
                                    (Dwarf_Error *)remaining);
        if (iVar1 == 1) {
          dbg_local._4_4_ = 1;
        }
        else if (dn_out_local < usedspace) {
          pDStack_78 = (Dwarf_Small *)
                       ((long)dn_out_local + *(long *)(starting_offset_local + 0x840));
          pDVar2 = pDStack_78 + usedspace;
          section_size = (Dwarf_Unsigned)_dwarf_get_alloc((Dwarf_Debug)starting_offset_local,'?',1);
          if ((Dwarf_Dnames_Head)section_size == (Dwarf_Dnames_Head)0x0) {
            _dwarf_error_string((Dwarf_Debug)starting_offset_local,(Dwarf_Error *)remaining,0x3e,
                                "DW_DLE_ALLOC_FAIL: dwarf_get_alloc of a Dwarf_Dnames_Head record failed."
                               );
            dbg_local._4_4_ = 1;
          }
          else {
            ((Dwarf_Dnames_Head)section_size)->dn_magic = 0xabcd;
            ((Dwarf_Dnames_Head)section_size)->dn_section_data = pDStack_78;
            ((Dwarf_Dnames_Head)section_size)->dn_section_size = usedspace;
            ((Dwarf_Dnames_Head)section_size)->dn_section_end = pDStack_78 + usedspace;
            ((Dwarf_Dnames_Head)section_size)->dn_dbg = (Dwarf_Debug)starting_offset_local;
            ((Dwarf_Dnames_Head)section_size)->dn_section_offset = (Dwarf_Unsigned)dn_out_local;
            ((Dwarf_Dnames_Head)section_size)->dn_indextable_data =
                 (Dwarf_Small *)((long)dn_out_local + (long)pDStack_78);
            dn = (Dwarf_Dnames_Head)
                 (((Dwarf_Dnames_Head)section_size)->dn_section_size - (long)dn_out_local);
            iVar1 = read_a_name_table_header
                              ((Dwarf_Dnames_Head)section_size,(Dwarf_Unsigned)dn_out_local,
                               (Dwarf_Unsigned)dn,pDStack_78,&next_offset,
                               (Dwarf_Unsigned *)&start_section,
                               ((Dwarf_Dnames_Head)section_size)->dn_section_end,
                               (Dwarf_Error *)remaining);
            dbg_local._4_4_ = iVar1;
            if (iVar1 == 1) {
              dwarf_dealloc_dnames((Dwarf_Dnames_Head)section_size);
            }
            else if (iVar1 == -1) {
              dwarf_dealloc_dnames((Dwarf_Dnames_Head)section_size);
            }
            else if (usedspace < next_offset) {
              dwarf_dealloc_dnames((Dwarf_Dnames_Head)section_size);
              _dwarf_error_string((Dwarf_Debug)starting_offset_local,(Dwarf_Error *)remaining,0x177,
                                  "DW_DLE_DEBUG_NAMES_OFF_END:  used space > section size");
              dbg_local._4_4_ = 1;
            }
            else {
              dn = (Dwarf_Dnames_Head)((long)dn - next_offset);
              if ((dn != (Dwarf_Dnames_Head)0x0) && (dn < (Dwarf_Dnames_Head)0xf)) {
                for (pDStack_78 = pDStack_78 + next_offset; pDStack_78 < pDVar2;
                    pDStack_78 = pDStack_78 + 1) {
                  if (*pDStack_78 != '\0') {
                    dwarf_dealloc((Dwarf_Debug)starting_offset_local,(Dwarf_Ptr)section_size,0x3f);
                    _dwarf_error_string((Dwarf_Debug)starting_offset_local,(Dwarf_Error *)remaining,
                                        0x176,
                                        "DW_DLE_DEBUG_NAMES_PAD_NON_ZERO: space at end of valid tables not zeros"
                                       );
                    return 1;
                  }
                }
              }
              *offset_of_next_table_local = section_size;
              *error_local = (Dwarf_Error)start_section;
              dbg_local._4_4_ = 0;
            }
          }
        }
        else {
          dbg_local._4_4_ = -1;
        }
      }
    }
  }
  return dbg_local._4_4_;
}

Assistant:

int
dwarf_dnames_header(Dwarf_Debug dbg,
    Dwarf_Off           starting_offset,
    Dwarf_Dnames_Head * dn_out,
    Dwarf_Off         * offset_of_next_table,
    Dwarf_Error       * error)
{
    Dwarf_Unsigned    remaining    = 0;
    Dwarf_Dnames_Head dn           = 0;
    Dwarf_Unsigned    section_size = 0;
    Dwarf_Unsigned    usedspace    = 0;
    Dwarf_Unsigned    next_offset  = 0;
    Dwarf_Small      *start_section= 0;
    Dwarf_Small      *end_section  = 0;
    Dwarf_Small      *curptr       = 0;
    int              res           = 0;

    CHECK_DBG(dbg,error,"dwarf_dnames_header()");
    res = _dwarf_load_section(dbg, &dbg->de_debug_names, error);
    if (res != DW_DLV_OK) {
        return res;
    }
    section_size = dbg->de_debug_names.dss_size;
    if (!section_size){
        return DW_DLV_NO_ENTRY;
    }
    res = _dwarf_load_section(dbg, &dbg->de_debug_str,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (starting_offset >= section_size) {
        return DW_DLV_NO_ENTRY;
    }
    start_section = dbg->de_debug_names.dss_data;
    curptr = start_section += starting_offset;
    end_section = start_section + section_size;
    dn =  (Dwarf_Dnames_Head)_dwarf_get_alloc(dbg,
        DW_DLA_DNAMES_HEAD, 1);
    if (!dn) {
        _dwarf_error_string(dbg, error, DW_DLE_ALLOC_FAIL,
            "DW_DLE_ALLOC_FAIL: dwarf_get_alloc of "
            "a Dwarf_Dnames_Head record failed.");
        return DW_DLV_ERROR;
    }
    dn->dn_magic = DWARF_DNAMES_MAGIC;
    dn->dn_section_data = start_section;
    dn->dn_section_size = section_size;
    dn->dn_section_end = start_section + section_size;
    dn->dn_dbg = dbg;
    dn->dn_section_offset = starting_offset;
    dn->dn_indextable_data = starting_offset + start_section;;
    remaining = dn->dn_section_size - starting_offset;
    res = read_a_name_table_header(dn,
        starting_offset,
        remaining,
        curptr,
        &usedspace,
        &next_offset,
        dn->dn_section_end,
        error);
    if (res == DW_DLV_ERROR) {
        dwarf_dealloc_dnames(dn);
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        /*  Impossible. A bug. Or possibly
            a bunch of zero pad? */
        dwarf_dealloc_dnames(dn);
        return res;
    }
    if (usedspace > section_size) {
        dwarf_dealloc_dnames(dn);
        _dwarf_error_string(dbg, error,DW_DLE_DEBUG_NAMES_OFF_END,
            "DW_DLE_DEBUG_NAMES_OFF_END: "
            " used space > section size");
        return DW_DLV_ERROR;
    }
    remaining -= usedspace;
    if (remaining && remaining < 15) {
        /*  No more content in here, just padding. Check for zero
            in padding. */
        curptr += usedspace;
        for ( ; curptr < end_section; ++curptr) {
            if (*curptr) {
                /*  One could argue this is a harmless error,
                    but for now assume it is real corruption. */
                dwarf_dealloc(dbg,dn,DW_DLA_DNAMES_HEAD);
                _dwarf_error_string(dbg, error,
                    DW_DLE_DEBUG_NAMES_PAD_NON_ZERO,
                    "DW_DLE_DEBUG_NAMES_PAD_NON_ZERO: "
                    "space at end of valid tables not zeros");
                return DW_DLV_ERROR;
            }
        }
    }
    *dn_out = dn;
    *offset_of_next_table = next_offset;
    return DW_DLV_OK;
}